

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTarget::IsAppBundleOnApple(cmTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (this->TargetTypeValue == EXECUTABLE) {
    this_00 = this->Makefile;
    std::__cxx11::string::string((string *)&local_38,"APPLE",&local_59);
    bVar1 = cmMakefile::IsOn(this_00,&local_38);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_58,"MACOSX_BUNDLE",&local_5a);
      bVar1 = GetPropertyAsBool(this,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmTarget::IsAppBundleOnApple() const
{
  return (this->GetType() == cmState::EXECUTABLE &&
          this->Makefile->IsOn("APPLE") &&
          this->GetPropertyAsBool("MACOSX_BUNDLE"));
}